

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

int stbtt__GetGlyphInfoT2(stbtt_fontinfo *info,int glyph_index,int *x0,int *y0,int *x1,int *y1)

{
  int iVar1;
  int iVar2;
  stbtt__csctx c;
  stbtt__csctx local_58;
  
  local_58.first_x = 0.0;
  local_58.first_y = 0.0;
  local_58.min_y = 0;
  local_58.max_y = 0;
  local_58.pvertices = (stbtt_vertex *)0x0;
  local_58.x = 0.0;
  local_58.y = 0.0;
  local_58.min_x = 0;
  local_58.max_x = 0;
  local_58.num_vertices = 0;
  local_58._52_4_ = 0;
  local_58.bounds = 1;
  local_58.started = 0;
  iVar1 = stbtt__run_charstring(info,glyph_index,&local_58);
  if (x0 != (int *)0x0) {
    iVar2 = iVar1;
    if (iVar1 != 0) {
      iVar2 = local_58.min_x;
    }
    *x0 = iVar2;
  }
  if (y0 != (int *)0x0) {
    iVar2 = iVar1;
    if (iVar1 != 0) {
      iVar2 = local_58.min_y;
    }
    *y0 = iVar2;
  }
  if (x1 != (int *)0x0) {
    iVar2 = iVar1;
    if (iVar1 != 0) {
      iVar2 = local_58.max_x;
    }
    *x1 = iVar2;
  }
  if (y1 != (int *)0x0) {
    if (iVar1 != 0) {
      iVar1 = local_58.max_y;
    }
    *y1 = iVar1;
  }
  return iVar1;
}

Assistant:

static int stbtt__GetGlyphInfoT2(const stbtt_fontinfo *info, int glyph_index, int *x0, int *y0, int *x1, int *y1)
{
   stbtt__csctx c = STBTT__CSCTX_INIT(1);
   int r = stbtt__run_charstring(info, glyph_index, &c);
   if (x0)  *x0 = r ? c.min_x : 0;
   if (y0)  *y0 = r ? c.min_y : 0;
   if (x1)  *x1 = r ? c.max_x : 0;
   if (y1)  *y1 = r ? c.max_y : 0;
   return r ? c.num_vertices : 0;
}